

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  
  printOpenHeader(this,_name);
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam0000000000194c70 = 0x2e2e2e2e2e2e2e;
    uRam0000000000194c77._0_1_ = '.';
    uRam0000000000194c77._1_1_ = '.';
    uRam0000000000194c77._2_1_ = '.';
    uRam0000000000194c77._3_1_ = '.';
    uRam0000000000194c77._4_1_ = '.';
    uRam0000000000194c77._5_1_ = '.';
    uRam0000000000194c77._6_1_ = '.';
    uRam0000000000194c77._7_1_ = '.';
    DAT_00194c60 = '.';
    DAT_00194c60_1._0_1_ = '.';
    DAT_00194c60_1._1_1_ = '.';
    DAT_00194c60_1._2_1_ = '.';
    DAT_00194c60_1._3_1_ = '.';
    DAT_00194c60_1._4_1_ = '.';
    DAT_00194c60_1._5_1_ = '.';
    DAT_00194c60_1._6_1_ = '.';
    uRam0000000000194c68 = 0x2e2e2e2e2e2e2e;
    DAT_00194c6f = 0x2e;
    DAT_00194c50 = '.';
    DAT_00194c50_1._0_1_ = '.';
    DAT_00194c50_1._1_1_ = '.';
    DAT_00194c50_1._2_1_ = '.';
    DAT_00194c50_1._3_1_ = '.';
    DAT_00194c50_1._4_1_ = '.';
    DAT_00194c50_1._5_1_ = '.';
    DAT_00194c50_1._6_1_ = '.';
    uRam0000000000194c58._0_1_ = '.';
    uRam0000000000194c58._1_1_ = '.';
    uRam0000000000194c58._2_1_ = '.';
    uRam0000000000194c58._3_1_ = '.';
    uRam0000000000194c58._4_1_ = '.';
    uRam0000000000194c58._5_1_ = '.';
    uRam0000000000194c58._6_1_ = '.';
    uRam0000000000194c58._7_1_ = '.';
    DAT_00194c40 = '.';
    DAT_00194c40_1._0_1_ = '.';
    DAT_00194c40_1._1_1_ = '.';
    DAT_00194c40_1._2_1_ = '.';
    DAT_00194c40_1._3_1_ = '.';
    DAT_00194c40_1._4_1_ = '.';
    DAT_00194c40_1._5_1_ = '.';
    DAT_00194c40_1._6_1_ = '.';
    uRam0000000000194c48._0_1_ = '.';
    uRam0000000000194c48._1_1_ = '.';
    uRam0000000000194c48._2_1_ = '.';
    uRam0000000000194c48._3_1_ = '.';
    uRam0000000000194c48._4_1_ = '.';
    uRam0000000000194c48._5_1_ = '.';
    uRam0000000000194c48._6_1_ = '.';
    uRam0000000000194c48._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam0000000000194c38._0_1_ = '.';
    uRam0000000000194c38._1_1_ = '.';
    uRam0000000000194c38._2_1_ = '.';
    uRam0000000000194c38._3_1_ = '.';
    uRam0000000000194c38._4_1_ = '.';
    uRam0000000000194c38._5_1_ = '.';
    uRam0000000000194c38._6_1_ = '.';
    uRam0000000000194c38._7_1_ = '.';
    DAT_00194c7f = 0;
  }
  poVar1 = std::operator<<((ostream *)
                           (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)46>()::line);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void ConsoleReporter::printClosedHeader(std::string const& _name) {
    printOpenHeader(_name);
    stream << getLineOfChars<'.'>() << '\n';
}